

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall
ipx::Model::ScaleBackInteriorSolution
          (Model *this,Vector *x,Vector *xl,Vector *xu,Vector *slack,Vector *y,Vector *zl,Vector *zu
          )

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  int *piVar7;
  double *pdVar8;
  double *pdVar9;
  
  if ((this->colscale_)._M_size != 0) {
    sVar2 = x->_M_size;
    pdVar9 = (this->colscale_)._M_data;
    if (0 < (long)sVar2) {
      pdVar8 = x->_M_data;
      pdVar6 = pdVar9;
      do {
        *pdVar8 = *pdVar6 * *pdVar8;
        pdVar8 = pdVar8 + 1;
        pdVar6 = pdVar6 + 1;
      } while (pdVar6 < pdVar9 + sVar2);
    }
    sVar2 = xl->_M_size;
    if (0 < (long)sVar2) {
      pdVar8 = xl->_M_data;
      pdVar6 = pdVar9;
      do {
        *pdVar8 = *pdVar6 * *pdVar8;
        pdVar8 = pdVar8 + 1;
        pdVar6 = pdVar6 + 1;
      } while (pdVar6 < pdVar9 + sVar2);
    }
    sVar2 = xu->_M_size;
    if (0 < (long)sVar2) {
      pdVar8 = xu->_M_data;
      pdVar6 = pdVar9;
      do {
        *pdVar8 = *pdVar6 * *pdVar8;
        pdVar8 = pdVar8 + 1;
        pdVar6 = pdVar6 + 1;
      } while (pdVar6 < pdVar9 + sVar2);
    }
    sVar2 = zl->_M_size;
    if (0 < (long)sVar2) {
      pdVar8 = zl->_M_data;
      pdVar6 = pdVar9;
      do {
        *pdVar8 = *pdVar8 / *pdVar6;
        pdVar8 = pdVar8 + 1;
        pdVar6 = pdVar6 + 1;
      } while (pdVar6 < pdVar9 + sVar2);
    }
    if (0 < (long)zu->_M_size) {
      pdVar8 = pdVar9 + zu->_M_size;
      pdVar6 = zu->_M_data;
      do {
        *pdVar6 = *pdVar6 / *pdVar9;
        pdVar6 = pdVar6 + 1;
        pdVar9 = pdVar9 + 1;
      } while (pdVar9 < pdVar8);
    }
  }
  if ((this->rowscale_)._M_size != 0) {
    sVar2 = y->_M_size;
    pdVar9 = (this->rowscale_)._M_data;
    if (0 < (long)sVar2) {
      pdVar8 = y->_M_data;
      pdVar6 = pdVar9;
      do {
        *pdVar8 = *pdVar6 * *pdVar8;
        pdVar8 = pdVar8 + 1;
        pdVar6 = pdVar6 + 1;
      } while (pdVar6 < pdVar9 + sVar2);
    }
    if (0 < (long)slack->_M_size) {
      pdVar8 = pdVar9 + slack->_M_size;
      pdVar6 = slack->_M_data;
      do {
        *pdVar6 = *pdVar6 / *pdVar9;
        pdVar6 = pdVar6 + 1;
        pdVar9 = pdVar9 + 1;
      } while (pdVar9 < pdVar8);
    }
  }
  piVar7 = (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->flipped_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar7 != piVar3) {
    pdVar9 = x->_M_data;
    pdVar8 = xl->_M_data;
    pdVar6 = xu->_M_data;
    pdVar4 = zl->_M_data;
    pdVar5 = zu->_M_data;
    do {
      iVar1 = *piVar7;
      pdVar9[iVar1] = -pdVar9[iVar1];
      pdVar6[iVar1] = pdVar8[iVar1];
      pdVar8[iVar1] = INFINITY;
      pdVar5[iVar1] = pdVar4[iVar1];
      pdVar4[iVar1] = 0.0;
      piVar7 = piVar7 + 1;
    } while (piVar7 != piVar3);
  }
  return;
}

Assistant:

void Model::ScaleBackInteriorSolution(Vector& x, Vector& xl, Vector& xu,
                                      Vector& slack, Vector& y, Vector& zl,
                                      Vector& zu) const {
    if (colscale_.size() > 0) {
        x *= colscale_;
        xl *= colscale_;
        xu *= colscale_;
        zl /= colscale_;
        zu /= colscale_;
    }
    if (rowscale_.size() > 0) {
        y *= rowscale_;
        slack /= rowscale_;
    }
    for (Int j : flipped_vars_) {
        assert(std::isfinite(xl[j]));
        assert(std::isinf(xu[j]));
        assert(zu[j] == 0.0);
        x[j] *= -1.0;
        xu[j] = xl[j];
        xl[j] = INFINITY;
        zu[j] = zl[j];
        zl[j] = 0.0;
    }
}